

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O2

bool __thiscall
Kernel::InterpretedLiteralEvaluator::
ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_>::tryEvaluateFunc
          (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_> *this,Term *trm
          ,TermList *res)

{
  anon_class_24_3_b5a48c42 action;
  TermList *pTVar1;
  bool bVar2;
  TermList TVar3;
  TermList *pTVar4;
  uint nums;
  ConstantType acc;
  int local_74;
  IntegerConstantType local_70;
  IntegerConstantType *local_60;
  int *piStack_58;
  Stack<Kernel::TermList> *local_50;
  Stack<Kernel::TermList> local_48;
  
  local_74 = 0;
  IntegerConstantType::IntegerConstantType
            (&local_70,
             (IntegerConstantType *)AbelianGroup<(Kernel::Theory::Interpretation)25>::IDENTITY);
  local_50 = &local_48;
  local_48._cursor = (TermList *)0x0;
  local_48._end = (TermList *)0x0;
  local_48._capacity = 0;
  local_48._stack = (TermList *)0x0;
  action.nums = (uint *)&local_74;
  action.acc = &local_70;
  action.keep = local_50;
  local_60 = &local_70;
  piStack_58 = &local_74;
  stackTraverseIf<Kernel::InterpretedLiteralEvaluator::ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>>::tryEvaluateFunc(Kernel::Term*,Kernel::TermList&)::_lambda(Kernel::TermList)_1_,Kernel::InterpretedLiteralEvaluator::ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>>::tryEvaluateFunc(Kernel::Term*,Kernel::TermList&)::_lambda(Kernel::Term&)_1_>
            ((TermList)trm,(anon_class_8_1_8991fb9c)this,action);
  if (local_74 == 0) {
LAB_004378ca:
    bVar2 = false;
  }
  else {
    if (local_74 == 1) {
      bVar2 = Kernel::operator!=(&local_70,
                                 (IntegerConstantType *)
                                 AbelianGroup<(Kernel::Theory::Interpretation)25>::IDENTITY);
      if (bVar2) goto LAB_004378ca;
    }
    bVar2 = Kernel::operator!=(&local_70,
                               (IntegerConstantType *)
                               AbelianGroup<(Kernel::Theory::Interpretation)25>::IDENTITY);
    if (bVar2) {
      TVar3._content = (uint64_t)Theory::representConstant((Theory *)theory,&local_70);
      Lib::Stack<Kernel::TermList>::push(&local_48,TVar3);
    }
    pTVar1 = local_48._cursor;
    if (local_48._stack == local_48._cursor) {
      TVar3._content =
           (uint64_t)
           Theory::representConstant
                     ((Theory *)theory,
                      (IntegerConstantType *)
                      AbelianGroup<(Kernel::Theory::Interpretation)25>::IDENTITY);
    }
    else {
      TVar3._content = (local_48._stack)->_content;
      pTVar4 = local_48._stack;
      while (pTVar4 = pTVar4 + 1, pTVar4 != pTVar1) {
        TVar3._content = (uint64_t)Term::create2(this->_fun,pTVar4->_content,TVar3);
      }
    }
    res->_content = (uint64_t)TVar3;
    bVar2 = (Term *)TVar3._content != trm;
  }
  Lib::Stack<Kernel::TermList>::~Stack(&local_48);
  IntegerConstantType::~IntegerConstantType(&local_70);
  return bVar2;
}

Assistant:

virtual bool tryEvaluateFunc(Term* trm, TermList& res) { 
    ASS_EQ(trm->functor(), _fun);
    ASS_EQ(trm->numTermArguments(),2);

    unsigned nums = 0;
    ConstantType acc = AbelianGroup::IDENTITY;
    Stack<TermList> keep;
    stackTraverseIf(TermList(trm), 
        /* we traverse only the parts with the same operation */
        [&](Term& t){ return t.functor() == _fun; },
        [&](TermList t) {
          ConstantType c;
          /* we eval constant parts */
          if (t.isTerm() && theory->tryInterpretConstant(t.term(), c)) {
            acc = AbelianGroup::groundEval(acc, c);
            nums++;
          } else {
            keep.push(t);
          }
        });
    if (nums == 0 || (nums == 1 && acc != AbelianGroup::IDENTITY)) {
      // only continue, if we updated acc more than once or at least saw a "_+0" somewhere
      return false;
    }

    if (acc != AbelianGroup::IDENTITY) {
      keep.push(TermList(theory->representConstant(acc)));
    }

    auto iter = Stack<TermList>::BottomFirstIterator(keep);
    if (!iter.hasNext()) {
      res = TermList(theory->representConstant(AbelianGroup::IDENTITY));
      return TermList(trm) != res;
    } else {
      TermList out = iter.next();
      while (iter.hasNext()) {
        auto t = iter.next();
        out = TermList(Term::create2(_fun, t, out));
      }
      res = out;
      return TermList(trm) != res;
    }
  }